

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::PastFunc::PastFunc(PastFunc *this)

{
  allocator<char> local_31;
  string local_30;
  PastFunc *local_10;
  PastFunc *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"$past",&local_31);
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,&local_30,Function);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine = (_func_int **)&PTR__PastFunc_009169c8;
  return;
}

Assistant:

PastFunc() : SystemSubroutine("$past", SubroutineKind::Function) {}